

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_stop_when_encountering_invalid_fix_version_Test::TestBody
          (visitor_test_should_stop_when_encountering_invalid_fix_version_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_118;
  Message local_110;
  Type local_108;
  Type local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  ErrorKind errorKind;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  undefined1 local_58 [8];
  VisitError<typename_AssertVisitor::ResultType> error;
  char *frame;
  visitor_test_should_stop_when_encountering_invalid_fix_version_Test *this_local;
  
  error.storage_._48_8_ = anon_var_dwarf_56546;
  doVisit<AssertVisitor,AssertVisitRules>
            ((Result<void,_Fixpp::ErrorKind> *)local_58,
             "8=FIX.5.1|9=0000|35=0|49=Prov|56=MDABC|10=213");
  bVar1 = Fixpp::result::Result<void,_Fixpp::ErrorKind>::isOk
                    ((Result<void,_Fixpp::ErrorKind> *)local_58);
  local_71 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_70,(AssertionResult *)"error.isOk()","true","false",in_R9
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,799,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (bVar1) {
    Fixpp::result::Result<void,_Fixpp::ErrorKind>::unwrapErr
              ((ErrorKind *)&gtest_ar.message_,(Result<void,_Fixpp::ErrorKind> *)local_58);
    local_104 = Fixpp::ErrorKind::type((ErrorKind *)&gtest_ar.message_);
    local_108 = InvalidVersion;
    testing::internal::EqHelper<false>::Compare<Fixpp::ErrorKind::Type,Fixpp::ErrorKind::Type>
              ((EqHelper<false> *)local_100,"errorKind.type()","Fixpp::ErrorKind::InvalidVersion",
               &local_104,&local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x322,pcVar2);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    Fixpp::ErrorKind::~ErrorKind((ErrorKind *)&gtest_ar.message_);
  }
  Fixpp::result::Result<void,_Fixpp::ErrorKind>::~Result((Result<void,_Fixpp::ErrorKind> *)local_58)
  ;
  return;
}

Assistant:

TEST(visitor_test, should_stop_when_encountering_invalid_fix_version)
{
    const char* frame = "8=FIX.5.1|9=0000|35=0|49=Prov|56=MDABC|10=213";

    auto error = doVisit(frame, AssertVisitor(), AssertVisitRules());
    ASSERT_FALSE(error.isOk());

    auto errorKind = error.unwrapErr();
    ASSERT_EQ(errorKind.type(), Fixpp::ErrorKind::InvalidVersion);
}